

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memheap.cpp
# Opt level: O2

void * __thiscall CHeap::Allocate(CHeap *this,uint Size)

{
  CChunk *pCVar1;
  char *pcVar2;
  
  pCVar1 = this->m_pCurrent;
  pcVar2 = pCVar1->m_pCurrent;
  if ((pCVar1->m_pEnd < pcVar2 + Size) ||
     (pCVar1->m_pCurrent = pcVar2 + Size, pcVar2 == (char *)0x0)) {
    NewChunk(this);
    pCVar1 = this->m_pCurrent;
    pcVar2 = pCVar1->m_pCurrent;
    if (pCVar1->m_pEnd < pcVar2 + Size) {
      pcVar2 = (char *)0x0;
    }
    else {
      pCVar1->m_pCurrent = pcVar2 + Size;
    }
  }
  return pcVar2;
}

Assistant:

void *CHeap::Allocate(unsigned int Size)
{
	// try to allocate from current chunk
	char *pMem = (char *)AllocateFromChunk(Size);
	if(!pMem)
	{
		// allocate new chunk and add it to the heap
		NewChunk();

		// try to allocate again
		pMem = (char *)AllocateFromChunk(Size);
	}

	return pMem;
}